

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

HighsStatus __thiscall Highs::formStandardFormLp(Highs *this)

{
  HighsSparseMatrix *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  iterator iVar8;
  int iVar9;
  long lVar10;
  int *__args;
  HighsInt iRow;
  ulong uVar11;
  iterator iVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  HighsInt *pHVar16;
  long lVar17;
  size_type __new_size;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double lower;
  uint local_3cc;
  vector<double,std::allocator<double>> *local_3c8;
  HighsSparseMatrix *local_3c0;
  uint local_3b4;
  double upper;
  vector<int,_std::allocator<int>_> slack_ix;
  uint local_390;
  uint local_38c;
  ulong local_378;
  ulong local_370;
  ulong local_368;
  HighsSparseMatrix local_row;
  HighsSparseMatrix local_2d0;
  HighsSparseMatrix local_260;
  HighsSparseMatrix local_1f0;
  HighsSparseMatrix local_180;
  HighsSparseMatrix local_110;
  HighsSparseMatrix local_a0;
  
  clearStandardFormLp(this);
  this_00 = &(this->model_).lp_.a_matrix_;
  HighsSparseMatrix::ensureRowwise(this_00);
  dVar22 = (double)(this->model_).lp_.sense_;
  this->standard_form_offset_ = (this->model_).lp_.offset_ * dVar22;
  uVar2 = (this->model_).lp_.num_col_;
  uVar11 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    lVar15 = 0;
    do {
      local_row._0_8_ =
           (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar15] * dVar22;
      iVar12._M_current =
           (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->standard_form_cost_,iVar12,(double *)&local_row);
        uVar11 = (ulong)(uint)(this->model_).lp_.num_col_;
      }
      else {
        *iVar12._M_current = (double)local_row._0_8_;
        (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar12._M_current + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar11);
  }
  (this->standard_form_matrix_).format_ = kRowwise;
  (this->standard_form_matrix_).num_col_ = (int)uVar11;
  HighsSparseMatrix::HighsSparseMatrix(&local_row);
  HighsSparseMatrix::ensureRowwise(&local_row);
  __new_size = 2;
  if (2 < (int)uVar11) {
    __new_size = uVar11;
  }
  local_row.num_row_ = 1;
  local_row.num_col_ = (this->model_).lp_.num_col_;
  std::vector<int,_std::allocator<int>_>::resize(&local_row.index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&local_row.value_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&local_row.start_,2);
  local_3c0 = &this->standard_form_matrix_;
  *local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = 0;
  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((this->model_).lp_.num_row_ < 1) {
    uVar11 = 0;
    local_370 = 0;
    uVar18 = 0;
    local_378 = 0;
    local_368 = 0;
  }
  else {
    pHVar16 = local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
    local_3c8 = (vector<double,std::allocator<double>> *)&this->standard_form_rhs_;
    lVar15 = 0;
    local_368 = 0;
    local_378 = 0;
    uVar18 = 0;
    local_370 = 0;
    uVar11 = 0;
    do {
      lower = (this->model_).lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar15];
      upper = (this->model_).lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar15];
      if ((-INFINITY < lower) || (upper < INFINITY)) {
        iRow = (HighsInt)lVar15;
        if ((lower != upper) || (NAN(lower) || NAN(upper))) {
          if (-INFINITY < lower) {
            local_3cc = ~(uint)((ulong)((long)(this->standard_form_rhs_).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->standard_form_rhs_).
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3);
            if (upper < INFINITY) {
              if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&slack_ix,
                           (iterator)
                           slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_3cc);
              }
              else {
                *slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_3cc;
                slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              HighsSparseMatrix::getRow
                        (this_00,iRow,pHVar16,
                         local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_row.value_.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              local_1f0.num_row_ = local_row.num_row_;
              local_1f0.format_ = local_row.format_;
              local_1f0.num_col_ = local_row.num_col_;
              std::vector<int,_std::allocator<int>_>::vector(&local_1f0.start_,&local_row.start_);
              std::vector<int,_std::allocator<int>_>::vector(&local_1f0.p_end_,&local_row.p_end_);
              std::vector<int,_std::allocator<int>_>::vector(&local_1f0.index_,&local_row.index_);
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_1f0.value_,&local_row.value_);
              HighsSparseMatrix::addRows(local_3c0,&local_1f0,(int8_t *)0x0);
              if (local_1f0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f0.value_.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1f0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f0.index_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1f0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f0.p_end_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1f0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f0.start_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              iVar12._M_current =
                   (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar12._M_current ==
                  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (local_3c8,iVar12,&lower);
                pdVar13 = (this->standard_form_rhs_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              else {
                *iVar12._M_current = lower;
                pdVar13 = iVar12._M_current + 1;
                (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish = pdVar13;
              }
              local_3cc = (int)((ulong)((long)pdVar13 - *(long *)local_3c8) >> 3) + 1;
              if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&slack_ix,
                           (iterator)
                           slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_3cc);
              }
              else {
                *slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_3cc;
                slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_260.format_ = local_row.format_;
              local_260.num_col_ = local_row.num_col_;
              local_260.num_row_ = local_row.num_row_;
              std::vector<int,_std::allocator<int>_>::vector(&local_260.start_,&local_row.start_);
              std::vector<int,_std::allocator<int>_>::vector(&local_260.p_end_,&local_row.p_end_);
              std::vector<int,_std::allocator<int>_>::vector(&local_260.index_,&local_row.index_);
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_260.value_,&local_row.value_);
              HighsSparseMatrix::addRows(local_3c0,&local_260,(int8_t *)0x0);
              if (local_260.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_260.value_.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_260.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_260.index_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_260.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_260.p_end_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_260.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_260.start_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              local_378 = (ulong)((int)local_378 + 1);
              iVar12._M_current =
                   (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              dVar20 = upper;
              if (iVar12._M_current !=
                  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0022ae76;
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_3c8,iVar12,&upper);
            }
            else {
              if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&slack_ix,
                           (iterator)
                           slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_3cc);
              }
              else {
                *slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_3cc;
                slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              HighsSparseMatrix::getRow
                        (this_00,iRow,pHVar16,
                         local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_row.value_.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              local_180.num_row_ = local_row.num_row_;
              local_180.format_ = local_row.format_;
              local_180.num_col_ = local_row.num_col_;
              std::vector<int,_std::allocator<int>_>::vector(&local_180.start_,&local_row.start_);
              std::vector<int,_std::allocator<int>_>::vector(&local_180.p_end_,&local_row.p_end_);
              std::vector<int,_std::allocator<int>_>::vector(&local_180.index_,&local_row.index_);
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_180.value_,&local_row.value_);
              HighsSparseMatrix::addRows(local_3c0,&local_180,(int8_t *)0x0);
              if (local_180.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_180.value_.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_180.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_180.index_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_180.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_180.p_end_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_180.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_180.start_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              uVar18 = (ulong)((int)uVar18 + 1);
              iVar12._M_current =
                   (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              dVar20 = lower;
              if (iVar12._M_current ==
                  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (local_3c8,iVar12,&lower);
              }
              else {
LAB_0022ae76:
                *iVar12._M_current = dVar20;
                (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
              }
            }
          }
          else {
            local_3cc = (int)((ulong)((long)(this->standard_form_rhs_).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->standard_form_rhs_).
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
            if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&slack_ix,
                         (iterator)
                         slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_3cc);
            }
            else {
              *slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_3cc;
              slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            HighsSparseMatrix::getRow
                      (this_00,iRow,pHVar16,
                       local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
            local_110.num_row_ = local_row.num_row_;
            local_110.format_ = local_row.format_;
            local_110.num_col_ = local_row.num_col_;
            std::vector<int,_std::allocator<int>_>::vector(&local_110.start_,&local_row.start_);
            std::vector<int,_std::allocator<int>_>::vector(&local_110.p_end_,&local_row.p_end_);
            std::vector<int,_std::allocator<int>_>::vector(&local_110.index_,&local_row.index_);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_110.value_,&local_row.value_);
            HighsSparseMatrix::addRows(local_3c0,&local_110,(int8_t *)0x0);
            if (local_110.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110.value_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_110.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
            }
            if (local_110.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
            }
            if (local_110.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
            }
            local_370 = (ulong)((int)local_370 + 1);
            iVar12._M_current =
                 (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            dVar20 = upper;
            if (iVar12._M_current !=
                (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0022ae76;
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (local_3c8,iVar12,&upper);
          }
        }
        else {
          HighsSparseMatrix::getRow
                    (this_00,iRow,pHVar16,
                     local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          local_a0.num_row_ = local_row.num_row_;
          local_a0.format_ = local_row.format_;
          local_a0.num_col_ = local_row.num_col_;
          std::vector<int,_std::allocator<int>_>::vector(&local_a0.start_,&local_row.start_);
          std::vector<int,_std::allocator<int>_>::vector(&local_a0.p_end_,&local_row.p_end_);
          std::vector<int,_std::allocator<int>_>::vector(&local_a0.index_,&local_row.index_);
          std::vector<double,_std::allocator<double>_>::vector(&local_a0.value_,&local_row.value_);
          HighsSparseMatrix::addRows(local_3c0,&local_a0,(int8_t *)0x0);
          if (local_a0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.value_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_a0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_a0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          local_368 = (ulong)((int)local_368 + 1);
          iVar12._M_current =
               (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          dVar20 = upper;
          if (iVar12._M_current !=
              (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) goto LAB_0022ae76;
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_3c8,iVar12,&upper);
        }
      }
      else {
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (this->model_).lp_.num_row_);
  }
  if (0 < (this->model_).lp_.num_col_) {
    local_3c8 = (vector<double,std::allocator<double>> *)&this->standard_form_cost_;
    lVar15 = 0;
    do {
      lower = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar15];
      if (((this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start[lVar15] != -INFINITY) && (lower != INFINITY)) {
        upper = 0.0;
        iVar12._M_current =
             (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_3c8,iVar12,&upper);
        }
        else {
          *iVar12._M_current = 0.0;
          (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        pHVar16 = &(this->standard_form_matrix_).num_col_;
        *pHVar16 = *pHVar16 + 1;
        local_2d0.num_col_ = local_row.num_col_ + 1;
        local_row.num_col_ = local_2d0.num_col_;
        *local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start = (int)lVar15;
        local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[1] = (this->standard_form_matrix_).num_col_ + -1;
        *local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 1.0;
        local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[1] = 1.0;
        local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[1] = 2;
        local_2d0.num_row_ = local_row.num_row_;
        local_2d0.format_ = local_row.format_;
        std::vector<int,_std::allocator<int>_>::vector(&local_2d0.start_,&local_row.start_);
        std::vector<int,_std::allocator<int>_>::vector(&local_2d0.p_end_,&local_row.p_end_);
        std::vector<int,_std::allocator<int>_>::vector(&local_2d0.index_,&local_row.index_);
        std::vector<double,_std::allocator<double>_>::vector(&local_2d0.value_,&local_row.value_);
        HighsSparseMatrix::addRows(local_3c0,&local_2d0,(int8_t *)0x0);
        if (local_2d0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.value_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2d0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_2d0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_2d0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar12._M_current =
             (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&this->standard_form_rhs_,iVar12,
                     &lower);
        }
        else {
          *iVar12._M_current = lower;
          (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (this->model_).lp_.num_col_);
  }
  HighsSparseMatrix::ensureColwise(this_00);
  HighsSparseMatrix::ensureColwise(local_3c0);
  iVar9 = (this->model_).lp_.num_col_;
  if (iVar9 < 1) {
    uVar14 = 0;
    uVar19 = 0;
    local_38c = 0;
    local_3b4 = 0;
    local_390 = 0;
  }
  else {
    this_01 = &(this->standard_form_matrix_).start_;
    local_3c8 = (vector<double,std::allocator<double>> *)&(this->standard_form_matrix_).value_;
    local_3c0 = (HighsSparseMatrix *)&(this->standard_form_matrix_).index_;
    lVar15 = 0;
    local_390 = 0;
    local_3b4 = 0;
    local_38c = 0;
    uVar19 = 0;
    uVar14 = 0;
    do {
      dVar21 = (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar15] * dVar22;
      dVar20 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar15];
      dVar1 = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar15];
      if (dVar20 == -INFINITY) {
        if (dVar1 == INFINITY) {
          lower = -dVar21;
          iVar12._M_current =
               (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&this->standard_form_cost_,iVar12,&lower);
          }
          else {
            *iVar12._M_current = lower;
            (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
          piVar5 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar9 = piVar5[lVar15];
          lVar10 = (long)iVar9;
          if (iVar9 < piVar5[lVar15 + 1]) {
            lVar17 = lVar10 * 4;
            do {
              __args = (int *)((long)(this->standard_form_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar17);
              iVar8._M_current =
                   (this->standard_form_matrix_).index_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
              if (iVar8._M_current ==
                  (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_3c0,iVar8,__args);
              }
              else {
                *iVar8._M_current = *__args;
                (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
              }
              lower = -*(double *)
                        ((long)(this->standard_form_matrix_).value_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar17 * 2);
              iVar12._M_current =
                   (this->standard_form_matrix_).value_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar12._M_current ==
                  (this->standard_form_matrix_).value_.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)local_3c8,iVar12,&lower);
              }
              else {
                *iVar12._M_current = lower;
                (this->standard_form_matrix_).value_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish = iVar12._M_current + 1;
              }
              lVar10 = lVar10 + 1;
              lVar17 = lVar17 + 4;
            } while (lVar10 < (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar15 + 1]);
          }
          iVar9 = (int)((ulong)((long)(this->standard_form_matrix_).index_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(this->standard_form_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2);
          lower = (double)CONCAT44(lower._4_4_,iVar9);
          iVar8._M_current =
               (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (this_01,iVar8,(int *)&lower);
          }
          else {
            *iVar8._M_current = iVar9;
            (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
          local_390 = local_390 + 1;
          iVar9 = (this->model_).lp_.num_col_;
        }
        else {
          local_3b4 = local_3b4 + 1;
          this->standard_form_offset_ = dVar21 * dVar1 + this->standard_form_offset_;
          (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15] = -dVar21;
          piVar5 = (this->standard_form_matrix_).start_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          iVar3 = piVar5[lVar15];
          lVar10 = (long)iVar3;
          iVar4 = piVar5[lVar15 + 1];
          if (iVar3 < iVar4) {
            pdVar6 = (this->standard_form_matrix_).value_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7 = (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            piVar5 = (this->standard_form_matrix_).index_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            do {
              iVar3 = piVar5[lVar10];
              pdVar7[iVar3] = pdVar7[iVar3] - pdVar6[lVar10] * dVar1;
              pdVar6[lVar10] = -pdVar6[lVar10];
              lVar10 = lVar10 + 1;
            } while (iVar4 != lVar10);
          }
        }
      }
      else {
        if (dVar1 == INFINITY) {
          local_38c = local_38c + 1;
        }
        else if ((dVar20 != dVar1) || (NAN(dVar20) || NAN(dVar1))) {
          uVar19 = (ulong)((int)uVar19 + 1);
        }
        else {
          uVar14 = (ulong)((int)uVar14 + 1);
        }
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          this->standard_form_offset_ = dVar21 * dVar20 + this->standard_form_offset_;
          piVar5 = (this->standard_form_matrix_).start_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          iVar3 = piVar5[lVar15];
          lVar10 = (long)iVar3;
          iVar4 = piVar5[lVar15 + 1];
          if (iVar3 < iVar4) {
            pdVar6 = (this->standard_form_matrix_).value_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7 = (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            piVar5 = (this->standard_form_matrix_).index_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            do {
              iVar3 = piVar5[lVar10];
              pdVar7[iVar3] = pdVar7[iVar3] - pdVar6[lVar10] * dVar20;
              lVar10 = lVar10 + 1;
            } while (iVar4 != lVar10);
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar9);
  }
  if (0 < (int)((ulong)((long)slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    local_3c0 = (HighsSparseMatrix *)&(this->standard_form_matrix_).index_;
    local_3c8 = (vector<double,std::allocator<double>> *)&(this->standard_form_matrix_).value_;
    lVar15 = 0;
    do {
      uVar2 = slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar15];
      lower = 0.0;
      iVar12._M_current =
           (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->standard_form_cost_,iVar12,&lower);
      }
      else {
        *iVar12._M_current = 0.0;
        (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar12._M_current + 1;
      }
      if ((int)uVar2 < 1) {
        lower = (double)CONCAT44(lower._4_4_,~uVar2);
        iVar8._M_current =
             (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_3c0,iVar8,(int *)&lower);
        }
        else {
          *iVar8._M_current = ~uVar2;
          (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        lower = -1.0;
        iVar12._M_current =
             (this->standard_form_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current !=
            (this->standard_form_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          *iVar12._M_current = -1.0;
          goto LAB_0022b976;
        }
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_3c8,iVar12,&lower);
      }
      else {
        lower = (double)CONCAT44(lower._4_4_,uVar2 - 1);
        iVar8._M_current =
             (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_3c0,iVar8,(int *)&lower);
        }
        else {
          *iVar8._M_current = uVar2 - 1;
          (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        lower = 1.0;
        iVar12._M_current =
             (this->standard_form_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current ==
            (this->standard_form_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_3c8,iVar12,&lower);
        }
        else {
          *iVar12._M_current = 1.0;
LAB_0022b976:
          (this->standard_form_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
      }
      iVar9 = (int)((ulong)((long)(this->standard_form_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->standard_form_matrix_).index_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      lower = (double)CONCAT44(lower._4_4_,iVar9);
      iVar8._M_current =
           (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&(this->standard_form_matrix_).start_,iVar8,(int *)&lower);
      }
      else {
        *iVar8._M_current = iVar9;
        (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar8._M_current + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)((ulong)((long)slack_ix.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)slack_ix.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  this->standard_form_valid_ = true;
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
               "Standard form LP obtained for LP with (free / lower / upper / boxed / fixed) variables (%d / %d / %d / %d / %d) and constraints (%d / %d / %d / %d / %d) \n"
               ,(ulong)local_390,(ulong)local_38c,(ulong)local_3b4,uVar19,uVar14,uVar11,uVar18,
               local_370,local_378,local_368);
  if (slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_row.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_row.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return kOk;
}

Assistant:

HighsStatus Highs::formStandardFormLp() {
  this->clearStandardFormLp();
  HighsLp& lp = this->model_.lp_;
  HighsSparseMatrix& matrix = lp.a_matrix_;
  // Ensure that the incumbent LP and standard form LP matrices are rowwise
  matrix.ensureRowwise();
  // Original rows are processed before columns, so that any original
  // boxed rows can be transformed to pairs of one-sided rows,
  // requiring the standard form matrix to be row-wise. The original
  // columns are assumed to come before any new columns, so their
  // costs (as a minimization) must be defined befor costs of new
  // columns.
  // Determine the objective scaling, and apply it to any offset
  HighsInt sense = HighsInt(lp.sense_);
  this->standard_form_offset_ = sense * lp.offset_;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    this->standard_form_cost_.push_back(sense * lp.col_cost_[iCol]);
  this->standard_form_matrix_.format_ = MatrixFormat::kRowwise;
  this->standard_form_matrix_.num_col_ = lp.num_col_;
  // Create a HighsSparseMatrix instance to store rows extracted from
  // the original constraint matrix
  HighsInt local_row_min_nnz = std::max(lp.num_col_, HighsInt(2));
  HighsSparseMatrix local_row;
  local_row.ensureRowwise();
  local_row.num_row_ = 1;
  local_row.num_col_ = lp.num_col_;
  local_row.index_.resize(local_row_min_nnz);
  local_row.value_.resize(local_row_min_nnz);
  local_row.start_.resize(2);
  HighsInt& num_nz = local_row.start_[1];
  local_row.start_[0] = 0;
  HighsInt num_fixed_row = 0;
  HighsInt num_boxed_row = 0;
  HighsInt num_lower_row = 0;
  HighsInt num_upper_row = 0;
  HighsInt num_free_row = 0;
  HighsInt num_fixed_col = 0;
  HighsInt num_boxed_col = 0;
  HighsInt num_lower_col = 0;
  HighsInt num_upper_col = 0;
  HighsInt num_free_col = 0;
  std::vector<HighsInt> slack_ix;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double lower = lp.row_lower_[iRow];
    double upper = lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      assert(0 == 1);
      // Free row
      num_free_row++;
      continue;
    }
    if (lower == upper) {
      // Equality row
      num_fixed_row++;
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
      continue;
    } else if (lower <= -kHighsInf) {
      // Upper bounded row, so record the slack
      num_upper_row++;
      assert(upper < kHighsInf);
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(standard_form_row + 1);
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    } else if (upper >= kHighsInf) {
      // Lower bounded row, so record the slack
      num_lower_row++;
      assert(lower > -kHighsInf);
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(-(standard_form_row + 1));
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(lower);
    } else {
      // Boxed row, so record the lower slack
      assert(lower > -kHighsInf);
      assert(upper < kHighsInf);
      num_boxed_row++;
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(-(standard_form_row + 1));
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(lower);
      // .. and upper slack, adding a copy of the row
      standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(standard_form_row + 1);
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    }
  }
  // Add rows corresponding to boxed columns
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    if (lower > -kHighsInf && upper < kHighsInf) {
      // Boxed column
      //
      // x will be replaced by x = l + X (below) with X >= 0
      //
      // Introduce variable s >= 0 so that (with x >= l still)
      //
      // x = u - s => x + s = u
      this->standard_form_cost_.push_back(0);
      this->standard_form_matrix_.num_col_++;
      local_row.num_col_++;
      local_row.index_[0] = iCol;
      local_row.index_[1] = this->standard_form_matrix_.num_col_ - 1;
      local_row.value_[0] = 1;
      local_row.value_[1] = 1;
      local_row.start_[1] = 2;
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    }
  }
  // Finished with both matrices, row-wise, so ensure that the
  // incumbent matrix leaves col-wise, and that the standard form
  // matrix is col-wise so RHS shifts can be applied and more columns
  // can be added
  matrix.ensureColwise();
  this->standard_form_matrix_.ensureColwise();
  // Work through the columns, ensuring that all have non-negativity bounds
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double cost = sense * lp.col_cost_[iCol];
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    if (lower > -kHighsInf) {
      // Finite lower bound
      if (upper < kHighsInf) {
        if (lower == upper) {
          // Fixed column
          num_fixed_col++;
        } else {
          // Boxed column
          num_boxed_col++;
        }
      } else {
        // Lower column
        num_lower_col++;
      }
      if (lower != 0) {
        // x >= l, so shift x-l = X >= 0, giving x = X + l
        //
        // Cost contribution c(X+l) = cX + cl
        this->standard_form_offset_ += cost * lower;
        // Constraint contribution a(X+l) = aX + al
        for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
             iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++)
          this->standard_form_rhs_[this->standard_form_matrix_.index_[iEl]] -=
              this->standard_form_matrix_.value_[iEl] * lower;
      }
    } else if (upper < kHighsInf) {
      // Upper column
      num_upper_col++;
      // Have to operate even if u=0, since cost and column values are negated
      //
      // x <= u, so shift u-x = X >= 0, giving x = u - X
      //
      // Cost contribution c(u-X) = cu - cX
      this->standard_form_offset_ += cost * upper;
      this->standard_form_cost_[iCol] = -cost;
      // Constraint contribution a(u-X) = -aX + au
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        this->standard_form_rhs_[this->standard_form_matrix_.index_[iEl]] -=
            this->standard_form_matrix_.value_[iEl] * upper;
        this->standard_form_matrix_.value_[iEl] =
            -this->standard_form_matrix_.value_[iEl];
      }
    } else {
      // Free column
      num_free_col++;
      // Represent as x = x+ - x-
      //
      // where original column is now x+ >= 0
      //
      // and x- >= 0 has negation of its cost and matrix column
      this->standard_form_cost_.push_back(-cost);
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        this->standard_form_matrix_.index_.push_back(
            this->standard_form_matrix_.index_[iEl]);
        this->standard_form_matrix_.value_.push_back(
            -this->standard_form_matrix_.value_[iEl]);
      }
      this->standard_form_matrix_.start_.push_back(
          HighsInt(this->standard_form_matrix_.index_.size()));
    }
  }
  // Now add the slack variables
  for (HighsInt iX = 0; iX < HighsInt(slack_ix.size()); iX++) {
    HighsInt iRow = slack_ix[iX];
    this->standard_form_cost_.push_back(0);
    if (iRow > 0) {
      this->standard_form_matrix_.index_.push_back(iRow - 1);
      this->standard_form_matrix_.value_.push_back(1);
    } else {
      this->standard_form_matrix_.index_.push_back(-iRow - 1);
      this->standard_form_matrix_.value_.push_back(-1);
    }
    this->standard_form_matrix_.start_.push_back(
        HighsInt(this->standard_form_matrix_.index_.size()));
  }
  this->standard_form_valid_ = true;
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Standard form LP obtained for LP with (free / lower / upper / "
               "boxed / fixed) variables"
               " (%d / %d / %d / %d / %d) and constraints"
               " (%d / %d / %d / %d / %d) \n",
               int(num_free_col), int(num_lower_col), int(num_upper_col),
               int(num_boxed_col), int(num_fixed_col), int(num_free_row),
               int(num_lower_row), int(num_upper_row), int(num_boxed_row),
               int(num_fixed_row));
  return HighsStatus::kOk;
}